

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O0

int Abc_NtkClauseMux(sat_solver *pSat,Abc_Obj_t *pNode,Abc_Obj_t *pNodeC,Abc_Obj_t *pNodeT,
                    Abc_Obj_t *pNodeE,Vec_Int_t *vVars)

{
  int iVar1;
  int v;
  int v_00;
  uint c;
  uint c_00;
  lit lVar2;
  int iVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  int fCompE;
  int fCompT;
  int VarE;
  int VarT;
  int VarI;
  int VarF;
  Vec_Int_t *vVars_local;
  Abc_Obj_t *pNodeE_local;
  Abc_Obj_t *pNodeT_local;
  Abc_Obj_t *pNodeC_local;
  Abc_Obj_t *pNode_local;
  sat_solver *pSat_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                  ,0x125,
                  "int Abc_NtkClauseMux(sat_solver *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = Abc_NodeIsMuxType(pNode);
  if (iVar1 != 0) {
    iVar1 = (pNode->field_6).iTemp;
    iVar4 = (pNodeC->field_6).iTemp;
    pAVar5 = Abc_ObjRegular(pNodeT);
    v = (pAVar5->field_6).iTemp;
    pAVar5 = Abc_ObjRegular(pNodeE);
    v_00 = (pAVar5->field_6).iTemp;
    c = Abc_ObjIsComplement(pNodeT);
    c_00 = Abc_ObjIsComplement(pNodeE);
    vVars->nSize = 0;
    lVar2 = toLitCond(iVar4,1);
    Vec_IntPush(vVars,lVar2);
    lVar2 = toLitCond(v,c ^ 1);
    Vec_IntPush(vVars,lVar2);
    lVar2 = toLitCond(iVar1,0);
    Vec_IntPush(vVars,lVar2);
    iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar3 == 0) {
      pSat_local._4_4_ = 0;
    }
    else {
      vVars->nSize = 0;
      lVar2 = toLitCond(iVar4,1);
      Vec_IntPush(vVars,lVar2);
      lVar2 = toLitCond(v,c);
      Vec_IntPush(vVars,lVar2);
      lVar2 = toLitCond(iVar1,1);
      Vec_IntPush(vVars,lVar2);
      iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
      if (iVar3 == 0) {
        pSat_local._4_4_ = 0;
      }
      else {
        vVars->nSize = 0;
        lVar2 = toLitCond(iVar4,0);
        Vec_IntPush(vVars,lVar2);
        lVar2 = toLitCond(v_00,c_00 ^ 1);
        Vec_IntPush(vVars,lVar2);
        lVar2 = toLitCond(iVar1,0);
        Vec_IntPush(vVars,lVar2);
        iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
        if (iVar3 == 0) {
          pSat_local._4_4_ = 0;
        }
        else {
          vVars->nSize = 0;
          lVar2 = toLitCond(iVar4,0);
          Vec_IntPush(vVars,lVar2);
          lVar2 = toLitCond(v_00,c_00);
          Vec_IntPush(vVars,lVar2);
          lVar2 = toLitCond(iVar1,1);
          Vec_IntPush(vVars,lVar2);
          iVar4 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
          if (iVar4 == 0) {
            pSat_local._4_4_ = 0;
          }
          else if (v == v_00) {
            pSat_local._4_4_ = 1;
          }
          else {
            vVars->nSize = 0;
            lVar2 = toLitCond(v,c);
            Vec_IntPush(vVars,lVar2);
            lVar2 = toLitCond(v_00,c_00);
            Vec_IntPush(vVars,lVar2);
            lVar2 = toLitCond(iVar1,1);
            Vec_IntPush(vVars,lVar2);
            iVar4 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
            if (iVar4 == 0) {
              pSat_local._4_4_ = 0;
            }
            else {
              vVars->nSize = 0;
              lVar2 = toLitCond(v,c ^ 1);
              Vec_IntPush(vVars,lVar2);
              lVar2 = toLitCond(v_00,c_00 ^ 1);
              Vec_IntPush(vVars,lVar2);
              lVar2 = toLitCond(iVar1,0);
              Vec_IntPush(vVars,lVar2);
              pSat_local._4_4_ =
                   sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
            }
          }
        }
      }
    }
    return pSat_local._4_4_;
  }
  __assert_fail("Abc_NodeIsMuxType( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                ,0x126,
                "int Abc_NtkClauseMux(sat_solver *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
               );
}

Assistant:

int Abc_NtkClauseMux( sat_solver * pSat, Abc_Obj_t * pNode, Abc_Obj_t * pNodeC, Abc_Obj_t * pNodeT, Abc_Obj_t * pNodeE, Vec_Int_t * vVars )
{
    int VarF, VarI, VarT, VarE, fCompT, fCompE;
//printf( "Adding mux %d.         %d\n", pNode->Id, (int)pSat->sat_solver_stats.clauses );

    assert( !Abc_ObjIsComplement( pNode ) );
    assert( Abc_NodeIsMuxType( pNode ) );
    // get the variable numbers
    VarF = (int)(ABC_PTRINT_T)pNode->pCopy;
    VarI = (int)(ABC_PTRINT_T)pNodeC->pCopy;
    VarT = (int)(ABC_PTRINT_T)Abc_ObjRegular(pNodeT)->pCopy;
    VarE = (int)(ABC_PTRINT_T)Abc_ObjRegular(pNodeE)->pCopy;
//    VarF = (int)pNode->Id;
//    VarI = (int)pNodeC->Id;
//    VarT = (int)Abc_ObjRegular(pNodeT)->Id;
//    VarE = (int)Abc_ObjRegular(pNodeE)->Id;

    // get the complementation flags
    fCompT = Abc_ObjIsComplement(pNodeT);
    fCompE = Abc_ObjIsComplement(pNodeE);

    // f = ITE(i, t, e)
    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'
    // create four clauses
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarI,  1) );
    Vec_IntPush( vVars, toLitCond(VarT,  1^fCompT) );
    Vec_IntPush( vVars, toLitCond(VarF,  0) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarI,  1) );
    Vec_IntPush( vVars, toLitCond(VarT,  0^fCompT) );
    Vec_IntPush( vVars, toLitCond(VarF,  1) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarI,  0) );
    Vec_IntPush( vVars, toLitCond(VarE,  1^fCompE) );
    Vec_IntPush( vVars, toLitCond(VarF,  0) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarI,  0) );
    Vec_IntPush( vVars, toLitCond(VarE,  0^fCompE) );
    Vec_IntPush( vVars, toLitCond(VarF,  1) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
 
    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return 1;
    }

    // two additional clauses
    // t' & e' -> f'       t  + e   + f'
    // t  & e  -> f        t' + e'  + f 
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarT,  0^fCompT) );
    Vec_IntPush( vVars, toLitCond(VarE,  0^fCompE) );
    Vec_IntPush( vVars, toLitCond(VarF,  1) );
    if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
        return 0;
    vVars->nSize = 0;
    Vec_IntPush( vVars, toLitCond(VarT,  1^fCompT) );
    Vec_IntPush( vVars, toLitCond(VarE,  1^fCompE) );
    Vec_IntPush( vVars, toLitCond(VarF,  0) );
    return sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
}